

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

bool __thiscall Directory::refresh(Directory *this)

{
  pointer pcVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  long *plVar5;
  long *plVar6;
  char *__s;
  string name;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  MutexLocker lock;
  stat entryStatus;
  value_type local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  MutexLocker local_d0;
  stat local_c0;
  
  MutexLocker::MutexLocker(&local_d0,this->dirMutex);
  this->valid = false;
  local_120 = &this->subDirs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_120);
  local_118 = &this->files;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_118);
  __dirp = opendir((this->path)._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
               ,0x6f,"Failed to open directory %s",(this->path)._M_dataplus._M_p);
  }
  else {
    while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
      if ((pdVar3->d_name[0] != '.') ||
         ((pdVar3->d_name[1] != '\0' && ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0'))))
         )) {
        __s = pdVar3->d_name;
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        sVar4 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,__s,__s + sVar4);
        pcVar1 = (this->path)._M_dataplus._M_p;
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,pcVar1,pcVar1 + (this->path)._M_string_length);
        std::__cxx11::string::append((char *)local_f0);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_f0,(ulong)local_140._M_dataplus._M_p);
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_100 = *plVar6;
          lStack_f8 = plVar5[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *plVar6;
          local_110 = (long *)*plVar5;
        }
        local_108 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0]);
        }
        iVar2 = lstat((char *)local_110,&local_c0);
        if (iVar2 == 0) {
          if ((local_c0.st_mode & 0xf000) == 0x4000) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_120,&local_140);
          }
          else {
            softHSMLog(7,"refresh",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
                       ,0xa8,"File not used %s",local_140._M_dataplus._M_p);
          }
        }
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
      }
    }
    closedir(__dirp);
    this->valid = true;
  }
  MutexLocker::~MutexLocker(&local_d0);
  return __dirp != (DIR *)0x0;
}

Assistant:

bool Directory::refresh()
{
	// Prevent concurrent call until valid is reset
	MutexLocker lock(dirMutex);

	// Reset the state
	valid = false;

	subDirs.clear();
	files.clear();

#ifndef _WIN32
	// Enumerate the directory
	DIR* dir = opendir(path.c_str());

	if (dir == NULL)
	{
		DEBUG_MSG("Failed to open directory %s", path.c_str());

		return false;
	}

	// Enumerate the directory
	struct dirent* entry = NULL;

	while ((entry = readdir(dir)) != NULL)
	{
		bool pushed = false;

		// Check if this is the . or .. entry
		if (!strcmp(entry->d_name, ".") || !strcmp(entry->d_name, ".."))
		{
			continue;
		}

		// Convert the name of the entry to a C++ string
		std::string name(entry->d_name);

#if defined(_DIRENT_HAVE_D_TYPE) && defined(_BSD_SOURCE)
		// Determine the type of the entry
		switch(entry->d_type)
		{
		case DT_DIR:
			// This is a directory
			subDirs.push_back(name);
			pushed = true;
			break;
		case DT_REG:
			// This is a regular file
			files.push_back(name);
			pushed = true;
			break;
		default:
			break;
		}
#endif
		if (!pushed) {
			// The entry type has to be determined using lstat
			struct stat entryStatus;

			std::string fullPath = path + OS_PATHSEP + name;

			if (!lstat(fullPath.c_str(), &entryStatus))
			{
				if (S_ISDIR(entryStatus.st_mode))
				{
					subDirs.push_back(name);
				}
				else if (S_ISREG(entryStatus.st_mode))
				{
					files.push_back(name);
				}
				else
				{
					DEBUG_MSG("File not used %s", name.c_str());
				}
			}
		}
	}

	// Close the directory
	closedir(dir);

#else
	// Enumerate the directory
	std::string pattern;
	intptr_t h;
	struct _finddata_t fi;

	if ((path.back() == '/') || (path.back() == '\\'))
		pattern = path + "*";
	else
		pattern = path + "/*";
	memset(&fi, 0, sizeof(fi));
	h = _findfirst(pattern.c_str(), &fi);
	if (h == -1)
	{
		// empty directory
		if (errno == ENOENT)
			goto finished;

		DEBUG_MSG("Failed to open directory %s", path.c_str());

		return false;
	}

	// scan files & subdirs
	do {
		// Check if this is the . or .. entry
		if (!strcmp(fi.name, ".") || !strcmp(fi.name, ".."))
			continue;

		if ((fi.attrib & _A_SUBDIR) == 0)
			files.push_back(fi.name);
		else
			subDirs.push_back(fi.name);

		memset(&fi, 0, sizeof(fi));
	} while (_findnext(h, &fi) == 0);

	(void) _findclose(h);

    finished:
#endif

	valid = true;

	return true;
}